

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_GetAddressByHash_Test::TestBody(AddressFactory_GetAddressByHash_Test *this)

{
  pointer *ppuVar1;
  bool bVar2;
  pointer __dest;
  ulong uVar3;
  size_t __n;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AddressFactory factory;
  Address address;
  ByteData local_4f8;
  ByteData local_4d8;
  AssertHelper local_4b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  AddressFactory local_4a8;
  undefined1 local_480 [4];
  undefined4 local_47c;
  undefined1 *local_470;
  undefined1 local_460 [16];
  void *local_450;
  long local_448;
  void *local_438;
  void *local_420;
  code *local_408 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_390;
  Script local_378;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_338;
  undefined1 local_308 [16];
  undefined1 *local_2f8;
  undefined1 local_2e8 [16];
  void *local_2d8;
  void *local_2c0;
  void *local_2a8;
  code *local_290 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_218;
  Script local_200;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  undefined1 local_190 [16];
  undefined1 *local_180;
  undefined1 local_170 [16];
  void *local_160;
  void *local_148;
  void *local_130;
  code *local_118 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a0;
  Script local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  cfd::AddressFactory::AddressFactory(&local_4a8,kRegtest);
  ppuVar1 = &local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d8,"c4d571179a455b8976b79cf99183fd2bbafe6bfd","");
  cfd::core::ByteData::ByteData(&local_4f8,(string *)&local_4d8);
  cfd::AddressFactory::GetAddressByHash((AddressType)local_480,(ByteData *)&local_4a8);
  if (local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_4d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = local_448 - (long)local_450;
  if (uVar3 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar3);
  }
  local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __dest + uVar3;
  __n = local_448 - (long)local_450;
  local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __dest;
  if (__n != 0) {
    local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = __dest;
    memmove(__dest,local_450,__n);
  }
  local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = __dest + __n;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_4b8,"address.GetHash().GetHex().c_str()",
             "\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\"",
             (char *)local_4d8.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,"c4d571179a455b8976b79cf99183fd2bbafe6bfd");
  if ((pointer *)
      local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_4d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4f8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_4b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_4d8);
    if (local_4b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_4b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xdb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4f8,(Message *)&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
    if ((pointer *)
        local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((pointer *)
          local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0)) {
        (**(code **)(*(pointer *)
                      local_4d8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + 8))();
      }
      local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_4b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_4f8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,local_47c);
  local_4b8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)&local_4d8,"address.GetAddressType()","AddressType::kP2pkhAddress",
             (AddressType *)&local_4f8,(AddressType *)&local_4b8);
  if (local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_4f8);
    if (local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_4d8.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xdc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4b8,(Message *)&local_4f8);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    if ((long *)local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_4f8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4d8,"c4d571179a455b8976b79cf99183fd2bbafe6bfd","");
    cfd::core::ByteData::ByteData(&local_4f8,(string *)&local_4d8);
    cfd::AddressFactory::GetAddressByHash((AddressType)local_190,(ByteData *)&local_4a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_48);
    cfd::core::Script::~Script(&local_88);
    local_118[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a0)
    ;
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_118);
    if (local_130 != (void *)0x0) {
      operator_delete(local_130);
    }
    if (local_148 != (void *)0x0) {
      operator_delete(local_148);
    }
    if (local_160 != (void *)0x0) {
      operator_delete(local_160);
    }
    if (local_180 != local_170) {
      operator_delete(local_180);
    }
    if ((long *)local_4f8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
      operator_delete(local_4f8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != ppuVar1) {
      operator_delete(local_4d8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_4d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_4f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xde,
             "Expected: factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData(\"c4d571179a455b8976b79cf99183fd2bbafe6bfd\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_4f8,(Message *)&local_4d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
  if ((pointer *)
      local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((pointer *)
        local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0)) {
      (**(code **)(*(pointer *)
                    local_4d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
    local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::ByteData::ByteData(&local_4d8);
    cfd::AddressFactory::GetAddressByHash((AddressType)local_308,(ByteData *)&local_4a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1c0);
    cfd::core::Script::~Script(&local_200);
    local_290[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_218);
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_290);
    if (local_2a8 != (void *)0x0) {
      operator_delete(local_2a8);
    }
    if (local_2c0 != (void *)0x0) {
      operator_delete(local_2c0);
    }
    if (local_2d8 != (void *)0x0) {
      operator_delete(local_2d8);
    }
    if (local_2f8 != local_2e8) {
      operator_delete(local_2f8);
    }
    if ((pointer *)
        local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0) {
      operator_delete(local_4d8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_4d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_4f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xdf,
             "Expected: factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_4f8,(Message *)&local_4d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4f8);
  if ((pointer *)
      local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((pointer *)
        local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer *)0x0)) {
      (**(code **)(*(pointer *)
                    local_4d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
    local_4d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_338);
  cfd::core::Script::~Script(&local_378);
  local_408[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_390);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_408);
  if (local_420 != (void *)0x0) {
    operator_delete(local_420);
  }
  if (local_438 != (void *)0x0) {
    operator_delete(local_438);
  }
  if (local_450 != (void *)0x0) {
    operator_delete(local_450);
  }
  if (local_470 != local_460) {
    operator_delete(local_470);
  }
  local_4a8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002dffd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_4a8.prefix_list_);
  return;
}

Assistant:

TEST(AddressFactory, GetAddressByHash)
{
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd"));
    EXPECT_STREQ(address.GetHash().GetHex().c_str(), "c4d571179a455b8976b79cf99183fd2bbafe6bfd");
    EXPECT_EQ(address.GetAddressType(), AddressType::kP2pkhAddress);

    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2wpkhAddress, ByteData("c4d571179a455b8976b79cf99183fd2bbafe6bfd")), CfdException);
    EXPECT_THROW(factory.GetAddressByHash(AddressType::kP2pkhAddress, ByteData()), CfdException);
  }
}